

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
HashCallback<Blob<224>_>::operator()(HashCallback<Blob<224>_> *this,void *key,int len)

{
  size_type sVar1;
  reference this_00;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  Blob<224> h;
  size_t newsize;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffd8;
  
  sVar1 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size
                    (*(vector<Blob<224>,_std::allocator<Blob<224>_>_> **)(in_RDI + 0x10));
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)(sVar1 + 1),in_stack_ffffffffffffffd8
            );
  Blob<224>::Blob((Blob<224> *)&stack0xffffffffffffffc4);
  (**(code **)(in_RDI + 0x18))(in_RSI,in_EDX,0,&stack0xffffffffffffffc4);
  this_00 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::back(in_stack_ffffffffffffffc0);
  Blob<224>::operator=(this_00,(Blob<224> *)&stack0xffffffffffffffc4);
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);

    m_hashes.back() = h;
  }